

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

void * array_rangeop_new(_class *class,t_symbol *s,int *argcp,t_atom **argvp,int onsetin,int nin,
                        int warnextra)

{
  _gobj **gp;
  _gobj **fp;
  t_float *fp_00;
  t_atomtype tVar1;
  t_object *owner;
  t_symbol *ptVar2;
  _inlet *p_Var3;
  char *pcVar4;
  t_atom *argv;
  int argc;
  t_atom *ptVar5;
  int argc_00;
  int iVar6;
  
  argc = *(int *)&s->s_name;
  argv = *(t_atom **)argcp;
  owner = (t_object *)pd_new(class);
  owner[1].te_g.g_pd = (t_pd)0x0;
  gp = &owner[1].te_g.g_next;
  owner[1].te_inlet = (_inlet *)0x0;
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  gpointer_init((t_gpointer *)gp);
  owner[2].te_outlet = (_outlet *)&s_;
  ptVar2 = gensym("y");
  owner[2].te_binbuf = (_binbuf *)ptVar2;
  fp = &owner[2].te_g.g_next;
  owner[2].te_g.g_next = (_gobj *)0xbf80000000000000;
  if ((int)argvp != 0) {
    floatinlet_new(owner,(t_float *)fp);
  }
  fp_00 = (t_float *)((long)&owner[2].te_g.g_next + 4);
  if (onsetin != 0) {
    floatinlet_new(owner,fp_00);
  }
  do {
    if (argc == 0) {
LAB_0017c24e:
      iVar6 = 0;
LAB_0017c28a:
      if (owner[1].te_inlet == (_inlet *)0x0) {
        symbolinlet_new(owner,(t_symbol **)(owner + 1));
      }
      else {
        pointerinlet_new(owner,(t_gpointer *)gp);
      }
      *(int *)&s->s_name = iVar6;
      *(t_atom **)argcp = argv;
      return owner;
    }
    tVar1 = argv->a_type;
    ptVar5 = argv;
    if (tVar1 != A_SYMBOL) {
LAB_0017c209:
      argv = ptVar5;
      argc_00 = argc;
      if (tVar1 == A_FLOAT) {
        *(t_float *)fp = (ptVar5->a_w).w_float;
        argv = ptVar5 + 1;
        iVar6 = 0;
        if (argc + -1 == 0) goto LAB_0017c28a;
        argc_00 = argc + -1;
        if (argv->a_type == A_FLOAT) {
          *fp_00 = ptVar5[1].a_w.w_float;
          argv = ptVar5 + 2;
          argc_00 = argc + -2;
          if (argc + -2 == 0) goto LAB_0017c28a;
        }
      }
      pcVar4 = class_getname(class);
      post("warning: %s ignoring extra argument: ",pcVar4);
      postatom(argc_00,argv);
      endpost();
      iVar6 = argc_00;
      goto LAB_0017c28a;
    }
    ptVar2 = ((t_pd)(argv->a_w).w_symbol)->c_name;
    if (*(char *)&ptVar2->s_name != '-') {
      if (owner[1].te_inlet == (_inlet *)0x0) {
        owner[1].te_g.g_pd = (t_pd)(argv->a_w).w_symbol;
      }
      else {
        pcVar4 = class_getname(class);
        pd_error(owner,"%s: extra names after -s..",pcVar4);
        postatom(argc,argv);
        endpost();
      }
      argv = argv + 1;
      argc = argc + -1;
      if (argc != 0) {
        tVar1 = argv->a_type;
        ptVar5 = argv;
        goto LAB_0017c209;
      }
      goto LAB_0017c24e;
    }
    if ((((*(char *)((long)&ptVar2->s_name + 1) == 's') && (2 < argc)) &&
        (*(char *)((long)&ptVar2->s_name + 2) == '\0')) &&
       ((argv[1].a_type == A_SYMBOL && (argv[2].a_type == A_SYMBOL)))) {
      p_Var3 = (_inlet *)canvas_makebindsym(argv[1].a_w.w_symbol);
      owner[1].te_inlet = p_Var3;
      *(word *)&owner[1].te_xpix = argv[2].a_w;
      argc = argc + -2;
      argv = argv + 2;
    }
    else if (((*(char *)((long)&ptVar2->s_name + 1) == 'f') &&
             ((2 < argc && *(char *)((long)&ptVar2->s_name + 2) == '\0' &&
              (argv[1].a_type == A_SYMBOL)))) && (argv[2].a_type == A_SYMBOL)) {
      owner[2].te_outlet = (_outlet *)argv[1].a_w;
      ptVar5 = argv + 2;
      argv = argv + 2;
      owner[2].te_binbuf = (_binbuf *)ptVar5->a_w;
      argc = argc + -2;
    }
    else {
      pcVar4 = class_getname(class);
      pd_error(owner,"%s: unknown flag ...",pcVar4);
      postatom(argc,argv);
      endpost();
    }
    argv = argv + 1;
    argc = argc + -1;
  } while( true );
}

Assistant:

static void *array_rangeop_new(t_class *class,
    t_symbol *s, int *argcp, t_atom **argvp,
    int onsetin, int nin, int warnextra)
{
    int argc = *argcp;
    t_atom *argv = *argvp;
    t_array_rangeop *x = (t_array_rangeop *)pd_new(class);
    x->x_sym = x->x_struct = x->x_field = 0;
    gpointer_init(&x->x_gp);
    x->x_elemtemplate = &s_;
    x->x_elemfield = gensym("y");
    x->x_onset = 0;
    x->x_n = -1;
    if (onsetin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_onset);
    if (nin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_n);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        if (!strcmp(argv->a_w.w_symbol->s_name, "-s") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->x_field = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(argv->a_w.w_symbol->s_name, "-f") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_elemtemplate = argv[1].a_w.w_symbol;
            x->x_elemfield = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else
        {
            pd_error(x, "%s: unknown flag ...", class_getname(class));
            postatom(argc, argv); endpost();
        }
        argc--; argv++;
    }
    if (argc && argv->a_type == A_SYMBOL)
    {
        if (x->x_struct)
        {
            pd_error(x, "%s: extra names after -s..", class_getname(class));
            postatom(argc, argv); endpost();
        }
        else x->x_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_onset = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_n = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && warnextra)
    {
        post("warning: %s ignoring extra argument: ", class_getname(class));
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_tc.tc_obj, &x->x_gp);
    else symbolinlet_new(&x->x_tc.tc_obj, &x->x_tc.tc_sym);
    *argcp = argc;
    *argvp = argv;
    return (x);
}